

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

int __thiscall
FOptionMenuScreenResolutionLine::Draw
          (FOptionMenuScreenResolutionLine *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  FFont *font;
  DFrameBuffer *this_00;
  int iVar1;
  char *string;
  int iVar2;
  int local_30;
  EColorRange local_2c;
  int x;
  EColorRange color;
  int colwidth;
  bool selected_local;
  int indent_local;
  int y_local;
  FOptionMenuDescriptor *desc_local;
  FOptionMenuScreenResolutionLine *this_local;
  
  iVar1 = DCanvas::GetWidth((DCanvas *)screen);
  for (local_30 = 0; this_00 = screen, font = SmallFont, local_30 < 3; local_30 = local_30 + 1) {
    if ((selected) && (this->mSelection == local_30)) {
      local_2c = OptionSettings.mFontColorSelection;
    }
    else if (local_30 == this->mHighlight) {
      local_2c = OptionSettings.mFontColorHighlight;
    }
    else {
      local_2c = OptionSettings.mFontColorValue;
    }
    iVar2 = CleanXfac_1 * 0x14;
    string = FString::operator_cast_to_char_(this->mResTexts + local_30);
    DCanvas::DrawText((DCanvas *)this_00,font,local_2c,(iVar1 / 3) * local_30 + iVar2,y,string,
                      0x40001394,1,0);
  }
  return (iVar1 / 3) * this->mSelection + CleanXfac_1 * 6;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		int colwidth = screen->GetWidth() / 3;
		EColorRange color;

		for (int x = 0; x < 3; x++)
		{
			if (selected && mSelection == x)
				color = OptionSettings.mFontColorSelection;
			else if (x == mHighlight)
				color = OptionSettings.mFontColorHighlight;
			else
				color = OptionSettings.mFontColorValue;

			screen->DrawText (SmallFont, color, colwidth * x + 20 * CleanXfac_1, y, mResTexts[x], DTA_CleanNoMove_1, true, TAG_DONE);
		}
		return colwidth * mSelection + 20 * CleanXfac_1 - CURSORSPACE;
	}